

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O3

float __thiscall benchmark_2::run_kernel(benchmark_2 *this,size_t iterations)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined4 in_register_00000004;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [64];
  undefined1 auVar9 [64];
  
  uVar3 = rdtsc();
  uVar4 = rdtsc();
  auVar1 = *(undefined1 (*) [32])(this->super_benchmark).mul0;
  auVar2 = *(undefined1 (*) [32])(this->super_benchmark).mul1;
  auVar5 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar6 = auVar5._0_4_;
  auVar9 = ZEXT3264(CONCAT428(uVar6,CONCAT424(uVar6,CONCAT420(uVar6,CONCAT416(uVar6,CONCAT412(uVar6,
                                                  CONCAT48(uVar6,CONCAT44(uVar6,uVar6))))))));
  auVar5 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,
                              uVar4 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar4)
                             );
  uVar6 = auVar5._0_4_;
  auVar10 = ZEXT3264(CONCAT428(uVar6,CONCAT424(uVar6,CONCAT420(uVar6,CONCAT416(uVar6,CONCAT412(uVar6
                                                  ,CONCAT48(uVar6,CONCAT44(uVar6,uVar6))))))));
  do {
    auVar5 = vfmadd231ps_fma(auVar9._0_32_,auVar1,auVar2);
    auVar9 = ZEXT1664(auVar5);
    auVar8 = vfmadd231ps_fma(auVar10._0_32_,auVar1,auVar2);
    auVar10 = ZEXT1664(auVar8);
    iterations = iterations - 1;
  } while (iterations != 0);
  auVar7._0_4_ = auVar5._0_4_ + auVar8._0_4_ + 0.0;
  auVar7._4_4_ = auVar5._4_4_ + auVar8._4_4_ + 0.0;
  auVar7._8_4_ = auVar5._8_4_ + auVar8._8_4_ + 0.0;
  auVar7._12_4_ = auVar5._12_4_ + auVar8._12_4_ + 0.0;
  auVar5 = vshufpd_avx(auVar7,auVar7,1);
  auVar8._0_4_ = auVar7._0_4_ + auVar5._0_4_;
  auVar8._4_4_ = auVar7._4_4_ + auVar5._4_4_;
  auVar8._8_4_ = auVar7._8_4_ + auVar5._8_4_;
  auVar8._12_4_ = auVar7._12_4_ + auVar5._12_4_;
  auVar5 = vhaddps_avx(auVar8,auVar8);
  return auVar5._0_4_;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r1);
            return __m256_reduce_add_ps(r0);
    }